

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v7::print<char[29],int,int,int,char>
               (FILE *f,char (*format_str) [29],int *args,int *args_1,int *args_2)

{
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_int,_int>
  *vargs;
  FILE *in_stack_000001b0;
  undefined1 in_stack_000001b8 [16];
  undefined1 in_stack_000001c8 [16];
  remove_reference_t<int> *in_stack_ffffffffffffff50;
  remove_reference_t<int> *in_stack_ffffffffffffff58;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_stack_ffffffffffffff60;
  char (*in_stack_ffffffffffffff68) [29];
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> local_88 [3];
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_58;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_18;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_10;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_8;
  
  make_args_checked<int,int,int,char[29],char>
            (in_stack_ffffffffffffff68,(remove_reference_t<int> *)in_stack_ffffffffffffff60.values_,
             in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  local_58 = local_88;
  to_string_view<char,_0>((char *)0x16c87b);
  local_20 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&stack0xffffffffffffff58;
  local_28 = local_58;
  local_18 = local_58;
  local_8 = local_58;
  local_10 = local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_20,0x111,local_58);
  vprint(in_stack_000001b0,(string_view)in_stack_000001c8,(format_args)in_stack_000001b8);
  return;
}

Assistant:

inline void print(std::FILE* f, const S& format_str, Args&&... args) {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return detail::is_unicode<Char>()
             ? vprint(f, to_string_view(format_str), vargs)
             : detail::vprint_mojibake(f, to_string_view(format_str), vargs);
}